

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O1

void __thiscall GPIOClass::GPIOClass(GPIOClass *this)

{
  (this->gpionum)._M_dataplus._M_p = (pointer)&(this->gpionum).field_2;
  (this->gpionum)._M_string_length = 0;
  (this->gpionum).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x10616a);
  return;
}

Assistant:

GPIOClass::GPIOClass()
{
    this->gpionum = "4"; //GPIO4 is default
}